

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainNN.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long *plVar8;
  long *plVar9;
  double *pdVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  double dVar16;
  undefined8 uVar17;
  int local_15cc;
  long *local_15c8;
  long *local_15b8;
  NaStdBackProp *local_15a0;
  NaNNUnit nn;
  int local_14ec;
  int local_14e8;
  int local_14e4;
  uint local_14dc;
  NaQuickProp qpe;
  double adStack_f88 [263];
  NaStdBackProp bpe;
  
  if (argc < 4) {
    printf("Usage: %s NN-file LearnIn LearnOut [TestIn TestOut [NN-out]]\n",*argv);
    iVar4 = 1;
  }
  else {
    NaOpenLogFile("TrainNN.log");
    signal(2,handle_sigint);
    pcVar7 = getenv("MAX_EPOCHS");
    if (pcVar7 == (char *)0x0) {
      iVar4 = -1;
    }
    else {
      iVar4 = atoi(pcVar7);
    }
    plVar8 = (long *)OpenInputDataFile(argv[2]);
    plVar9 = (long *)OpenInputDataFile(argv[3]);
    local_15c8 = plVar9;
    local_15b8 = plVar8;
    if (argc != 4) {
      pcVar7 = argv[4];
      if ((*pcVar7 != '-') || (pcVar7[1] != '\0')) {
        local_15b8 = (long *)OpenInputDataFile(pcVar7);
      }
      if ((5 < (uint)argc) && ((pcVar7 = argv[5], *pcVar7 != '-' || (pcVar7[1] != '\0')))) {
        local_15c8 = (long *)OpenInputDataFile(pcVar7);
      }
    }
    NaNNUnit::NaNNUnit(&nn);
    NaNNUnit::Load((char *)&nn);
    local_15a0 = &bpe;
    NaStdBackProp::NaStdBackProp(local_15a0,&nn);
    NaQuickProp::NaQuickProp(&qpe,&nn);
    pcVar7 = getenv("QPROP_MU");
    if (pcVar7 != (char *)0x0) {
      dVar16 = atof(pcVar7);
      *(double *)((long)adStack_f88 + *(long *)(_qpe + -0x18)) = dVar16;
      local_15a0 = (NaStdBackProp *)(&qpe + *(long *)(_qpe + -0x28));
    }
    pdVar10 = (double *)
              operator_new__((ulong)(local_14e4 * local_14dc + local_14e8 * local_14ec) << 3);
    uVar15 = (ulong)local_14dc << 3;
    pvVar11 = operator_new__(uVar15);
    pvVar12 = operator_new__(uVar15);
    pvVar13 = operator_new__(uVar15);
    pvVar14 = operator_new__(uVar15);
    iVar2 = 0;
    while (bTerminate == false) {
      for (uVar15 = 0; local_14dc != uVar15; uVar15 = uVar15 + 1) {
        *(undefined8 *)((long)pvVar14 + uVar15 * 8) = 0;
        *(undefined8 *)((long)pvVar13 + uVar15 * 8) = 0;
      }
      cVar3 = (**(code **)(*plVar8 + 0x28))();
      if ((cVar3 != '\0') && (cVar3 = (**(code **)(*plVar9 + 0x28))(), cVar3 != '\0')) {
        local_15cc = 0;
        do {
          for (uVar15 = 0; uVar15 < local_14e4 * local_14dc + local_14e8 * local_14ec;
              uVar15 = uVar15 + 1) {
            dVar16 = (double)(**(code **)(*plVar8 + 0x18))(plVar8,uVar15 & 0xffffffff);
            pdVar10[uVar15] = dVar16;
          }
          for (uVar15 = 0; uVar15 < local_14dc; uVar15 = uVar15 + 1) {
            uVar17 = (**(code **)(*plVar9 + 0x18))(plVar9,uVar15 & 0xffffffff);
            *(undefined8 *)((long)pvVar11 + uVar15 * 8) = uVar17;
          }
          NaNNUnit::Function((double *)&nn,pdVar10);
          for (uVar15 = 0; local_14dc != uVar15; uVar15 = uVar15 + 1) {
            dVar16 = *(double *)((long)pvVar11 + uVar15 * 8) -
                     *(double *)((long)pvVar12 + uVar15 * 8);
            *(double *)((long)pvVar13 + uVar15 * 8) =
                 dVar16 * dVar16 + *(double *)((long)pvVar13 + uVar15 * 8);
          }
          for (iVar5 = NaNNUnit::OutputLayer(); -1 < iVar5; iVar5 = iVar5 + -1) {
            iVar6 = NaNNUnit::OutputLayer();
            if (iVar5 == iVar6) {
              (**(code **)(*(long *)local_15a0 + 0x30))(local_15a0,pvVar11,0);
            }
            else {
              (**(code **)(*(long *)local_15a0 + 0x38))(local_15a0,iVar5,iVar5 + 1);
            }
          }
          cVar3 = (**(code **)(*plVar8 + 0x20))();
          local_15cc = local_15cc + 1;
        } while ((cVar3 != '\0') && (cVar3 = (**(code **)(*plVar9 + 0x20))(), cVar3 != '\0'));
        for (uVar15 = 0; local_14dc != uVar15; uVar15 = uVar15 + 1) {
          *(double *)((long)pvVar13 + uVar15 * 8) =
               *(double *)((long)pvVar13 + uVar15 * 8) / (double)local_15cc;
        }
      }
      cVar3 = (**(code **)(*local_15b8 + 0x28))();
      if ((cVar3 != '\0') && (cVar3 = (**(code **)(*local_15c8 + 0x28))(), cVar3 != '\0')) {
        iVar5 = 0;
        do {
          for (uVar15 = 0; uVar15 < local_14e4 * local_14dc + local_14e8 * local_14ec;
              uVar15 = uVar15 + 1) {
            dVar16 = (double)(**(code **)(*local_15b8 + 0x18))(local_15b8,uVar15 & 0xffffffff);
            pdVar10[uVar15] = dVar16;
          }
          for (uVar15 = 0; uVar15 < local_14dc; uVar15 = uVar15 + 1) {
            uVar17 = (**(code **)(*local_15c8 + 0x18))(local_15c8,uVar15 & 0xffffffff);
            *(undefined8 *)((long)pvVar11 + uVar15 * 8) = uVar17;
          }
          NaNNUnit::Function((double *)&nn,pdVar10);
          for (uVar15 = 0; local_14dc != uVar15; uVar15 = uVar15 + 1) {
            dVar16 = *(double *)((long)pvVar11 + uVar15 * 8) -
                     *(double *)((long)pvVar12 + uVar15 * 8);
            *(double *)((long)pvVar14 + uVar15 * 8) =
                 dVar16 * dVar16 + *(double *)((long)pvVar14 + uVar15 * 8);
          }
          cVar3 = (**(code **)(*local_15b8 + 0x20))();
          iVar5 = iVar5 + 1;
        } while ((cVar3 != '\0') && (cVar3 = (**(code **)(*local_15c8 + 0x20))(), cVar3 != '\0'));
        for (uVar15 = 0; local_14dc != uVar15; uVar15 = uVar15 + 1) {
          *(double *)((long)pvVar14 + uVar15 * 8) =
               *(double *)((long)pvVar14 + uVar15 * 8) / (double)iVar5;
        }
      }
      (**(code **)(*(long *)local_15a0 + 0x28))();
      iVar5 = iVar2 + 1;
      printf("%d\t");
      for (uVar15 = 0; uVar15 < local_14dc; uVar15 = uVar15 + 1) {
        printf(" %g",*(undefined8 *)((long)pvVar13 + uVar15 * 8));
      }
      putchar(9);
      for (uVar15 = 0; uVar15 < local_14dc; uVar15 = uVar15 + 1) {
        printf(" %g",*(undefined8 *)((long)pvVar14 + uVar15 * 8));
      }
      putchar(10);
      bVar1 = iVar4 <= iVar2;
      iVar2 = iVar5;
      if (bVar1) {
        bTerminate = true;
      }
    }
    NaNNUnit::Save((char *)&nn);
    NaQuickProp::~NaQuickProp(&qpe);
    NaStdBackProp::~NaStdBackProp(&bpe);
    NaNNUnit::~NaNNUnit(&nn);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc < 4)
    {
      printf("Usage: %s NN-file LearnIn LearnOut [TestIn TestOut [NN-out]]\n",
	     argv[0]);
      return 1;
    }

  NaOpenLogFile("TrainNN.log");

  /* Let's handle SIGINT(2) */
  signal(SIGINT, handle_sigint);

  int	nMaxEpochs = -1;	// unlimited
  char	*szMaxEpochs = getenv("MAX_EPOCHS");
  if(NULL != szMaxEpochs) {
      nMaxEpochs = atoi(szMaxEpochs);
  }

  try{
    NaDataFile	*dfLeIn = OpenInputDataFile(argv[2]);
    NaDataFile	*dfLeOut = OpenInputDataFile(argv[3]);

    NaDataFile	*dfTeIn = dfLeIn, *dfTeOut = dfLeOut;

    if(argc > 4 && strcmp(argv[4], "-"))
      dfTeIn = OpenInputDataFile(argv[4]);
    if(argc > 5 && strcmp(argv[5], "-"))
      dfTeOut = OpenInputDataFile(argv[5]);

    NaNNUnit            nn;
    nn.Load(argv[1]);

    NaStdBackProp	bpe(nn);
    NaQuickProp		qpe(nn);
    NaStdBackProp	*nnteacher = &bpe;

    char		*szQPropMu = getenv("QPROP_MU");
    if(NULL != szQPropMu) {
	qpe.mu = atof(szQPropMu);
	nnteacher = &qpe;
    }

    /* Prepare buffers for input, target and output data */
    NaReal	*pIn = new NaReal[nn.descr.InputsNumber()];
    NaReal	*pTar = new NaReal[nn.descr.nOutNeurons];
    NaReal	*pOut = new NaReal[nn.descr.nOutNeurons];

    NaReal	*pLeMSE = new NaReal[nn.descr.nOutNeurons];
    NaReal	*pTeMSE = new NaReal[nn.descr.nOutNeurons];

    /* Let's start the learning */
    int	iEpoch = 0, iLayer, j;

    while(!bTerminate)
      {
	++iEpoch;

	/* Reset error counters */
	for(j = 0; j < nn.descr.nOutNeurons; ++j)
	  pLeMSE[j] = pTeMSE[j] = 0.0;

	/* Learning epoch */
	if(dfLeIn->GoStartRecord() && dfLeOut->GoStartRecord())
	  {
	    int	nSamples = 0;

	    do{
	      /* Read the learning pair */
	      for(j = 0; j < nn.descr.InputsNumber(); ++j)
		pIn[j] = dfLeIn->GetValue(j);
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pTar[j] = dfLeOut->GetValue(j);

	      /* Pass through the net in forward direction */
	      nn.Function(pIn, pOut);

	      /* Compute sum of squared error */
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pLeMSE[j] += (pTar[j] - pOut[j]) * (pTar[j] - pOut[j]);

	      /* Pass through the net in backward direction */
	      for(iLayer = nn.OutputLayer(); iLayer >= 0; --iLayer)
		{
		  if(nn.OutputLayer() == iLayer)
		    /* Output layer */
		    nnteacher->DeltaRule(pTar);
		  else
		    /* Hidden layer */
		    nnteacher->DeltaRule(iLayer, iLayer + 1);
		}

	      ++nSamples;

	    }while(dfLeIn->GoNextRecord() && dfLeOut->GoNextRecord());

	    /* Compute mean squared error */
	    for(j = 0; j < nn.descr.nOutNeurons; ++j)
	      pLeMSE[j] /= nSamples;
	  }

	/* Testing epoch */
	if(dfTeIn->GoStartRecord() && dfTeOut->GoStartRecord())
	  {
	    int	nSamples = 0;

	    do{
	      /* Read the learning pair */
	      for(j = 0; j < nn.descr.InputsNumber(); ++j)
		pIn[j] = dfTeIn->GetValue(j);
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pTar[j] = dfTeOut->GetValue(j);

	      /* Pass through the net in forward direction */
	      nn.Function(pIn, pOut);

	      /* Compute sum of squared error */
	      for(j = 0; j < nn.descr.nOutNeurons; ++j)
		pTeMSE[j] += (pTar[j] - pOut[j]) * (pTar[j] - pOut[j]);

	      ++nSamples;

	    }while(dfTeIn->GoNextRecord() && dfTeOut->GoNextRecord());

	    /* Compute mean squared error */
	    for(j = 0; j < nn.descr.nOutNeurons; ++j)
	      pTeMSE[j] /= nSamples;
	  }

	/* Update the NN weights at the end of each epoch */
	nnteacher->UpdateNN();

	/* Display epoch number, learning and testing errors */
	printf("%d\t", iEpoch);

	for(j = 0; j < nn.descr.nOutNeurons; ++j)
	  printf(" %g", pLeMSE[j]);

	putchar('\t');

	for(j = 0; j < nn.descr.nOutNeurons; ++j)
	  printf(" %g", pTeMSE[j]);

	putchar('\n');

	if(iEpoch > nMaxEpochs)
	    bTerminate = true;

      }/* End of learning loop */

    if(argc > 6)
      nn.Save(argv[6]);
    else
      nn.Save(argv[1]);
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }
}